

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O0

bool __thiscall
DynamicScalableKReach::DynamicPartialIndex::double_intermediate
          (DynamicPartialIndex *this,vertex_t s,vertex_t t)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  reference __k;
  reference __k_00;
  mapped_type *pmVar4;
  byte *pbVar5;
  value_type *j;
  const_iterator __end2;
  const_iterator __begin2;
  Index *__range2;
  value_type *i;
  const_iterator __end1;
  const_iterator __begin1;
  Index *__range1;
  vertex_t t_local;
  vertex_t s_local;
  DynamicPartialIndex *this_local;
  
  __end1 = std::
           unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           ::begin(&this->succ_);
  i = (value_type *)
      std::
      unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end(&this->succ_);
  do {
    bVar3 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                       ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                         *)&i);
    if (!bVar3) {
      return false;
    }
    __k = std::__detail::
          _Node_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
          ::operator*(&__end1);
    __end2 = std::
             unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::begin(&this->succ_);
    j = (value_type *)
        std::
        unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::end(&this->succ_);
    while (bVar3 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                *)&j), bVar3) {
      __k_00 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
               ::operator*(&__end2);
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::at(&this->pred_,&__k->first);
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(pmVar4,(ulong)s);
      bVar1 = *pbVar5;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::at(&this->succ_,&__k->first);
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         (pmVar4,(ulong)__k_00->first);
      bVar2 = *pbVar5;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::at(&this->succ_,&__k_00->first);
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(pmVar4,(ulong)t);
      if ((uint)bVar1 + (uint)bVar2 + (uint)*pbVar5 <= (uint)this->k_) {
        return true;
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
      ::operator++(&__end2);
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false,_false>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool DynamicScalableKReach::DynamicPartialIndex::double_intermediate(vertex_t s, vertex_t t) const {
    for (const auto &i : succ_) {
        for (const auto &j : succ_) {
            if (pred_.at(i.first).at(s) + succ_.at(i.first).at(j.first) + succ_.at(j.first).at(t) <= k_) {
                return true;
            }
        }
    }
    return false;
}